

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knowledge_dynamics.cc
# Opt level: O1

void __thiscall
explode::knowledge_dynamics::knowledge_dynamics(knowledge_dynamics *this,input_exe_file *inp)

{
  ushort uVar1;
  ushort uVar2;
  input *piVar3;
  uint16_t *puVar4;
  int iVar5;
  int i;
  long lVar6;
  uchar local_98 [8];
  uchar mzHeader2 [37];
  inmem_input mio;
  input_exe_file inner;
  
  piVar3 = input_exe_file::file(inp);
  this->m_file = piVar3;
  puVar4 = exe_file::operator[](&inp->super_exe_file,NUM_OF_PAGES);
  lVar6 = (ulong)*puVar4 * 0x200;
  puVar4 = exe_file::operator[](&inp->super_exe_file,NUM_OF_BYTES_IN_LAST_PAGE);
  if (*puVar4 != 0) {
    puVar4 = exe_file::operator[](&inp->super_exe_file,NUM_OF_BYTES_IN_LAST_PAGE);
    lVar6 = lVar6 + (ulong)*puVar4 + -0x200;
  }
  (*this->m_file->_vptr_input[5])(this->m_file,lVar6);
  (*this->m_file->_vptr_input[2])(this->m_file,local_98,0x25);
  inmem_input::inmem_input((inmem_input *)(mzHeader2 + 0x20),local_98,0x25);
  input_exe_file::input_exe_file((input_exe_file *)&mio.m_ptr,(input *)(mzHeader2 + 0x20));
  puVar4 = exe_file::operator[]((exe_file *)&mio.m_ptr,HEADER_SIZE_PARA);
  uVar1 = *puVar4;
  puVar4 = exe_file::operator[]((exe_file *)&mio.m_ptr,NUM_OF_PAGES);
  uVar2 = *puVar4;
  puVar4 = exe_file::operator[]((exe_file *)&mio.m_ptr,NUM_OF_BYTES_IN_LAST_PAGE);
  iVar5 = (uint)uVar2 * 0x200;
  if (*puVar4 != 0) {
    puVar4 = exe_file::operator[]((exe_file *)&mio.m_ptr,NUM_OF_BYTES_IN_LAST_PAGE);
    iVar5 = iVar5 + (uint)*puVar4 + -0x200;
  }
  this->m_expected_size = iVar5 + (uint)uVar1 * -0x10;
  this->m_code_offs = (int)lVar6 + (uint)uVar1 * 0x10;
  lVar6 = 0;
  do {
    puVar4 = exe_file::operator[]((exe_file *)&mio.m_ptr,(header_t)lVar6);
    this->m_header[lVar6] = *puVar4;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0xe);
  input::~input((input *)(mzHeader2 + 0x20));
  return;
}

Assistant:

knowledge_dynamics::knowledge_dynamics(input_exe_file& inp)
    : m_file(inp.file())
  {
    offset_type extra_data_start = inp [exe_file::NUM_OF_PAGES] * 512L;
    if (inp[exe_file::NUM_OF_BYTES_IN_LAST_PAGE])
      {
	extra_data_start = static_cast <offset_type> (extra_data_start - (512 - inp[exe_file::NUM_OF_BYTES_IN_LAST_PAGE]));
      }
    unsigned char mzHeader2[0x25];
    m_file.seek(extra_data_start);
    m_file.read_buff(reinterpret_cast<char*>(mzHeader2), 0x25);

    explode::inmem_input mio(mzHeader2, 0x25);
    input_exe_file inner (mio);
    offset_type exe_data_start2 = inner[exe_file::HEADER_SIZE_PARA] * 16L; 
    offset_type extra_data_start2 = inner[exe_file::NUM_OF_PAGES] * 512L;
    if (inner[exe_file::NUM_OF_BYTES_IN_LAST_PAGE])
      {
	extra_data_start2 = static_cast <offset_type> (extra_data_start2 - (512 - inner[exe_file::NUM_OF_BYTES_IN_LAST_PAGE]));
      }
    m_expected_size = static_cast <uint32_t>  (extra_data_start2 - exe_data_start2);
    m_code_offs = static_cast <uint32_t>(extra_data_start + exe_data_start2);
    for (int i = 0; i < exe_file::MAX_HEADER_VAL; i++)
      {
	m_header[i] = inner[static_cast <exe_file::header_t> (i)];
      }
  }